

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLLoader.cpp
# Opt level: O1

int Load_EXT_framebuffer_object(void)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  
  sf_ptrc_glBindFramebufferEXT =
       (_func_void_GLenum_GLuint *)sf::Context::getFunction("glBindFramebufferEXT");
  bVar8 = sf_ptrc_glBindFramebufferEXT == (_func_void_GLenum_GLuint *)0x0;
  sf_ptrc_glBindRenderbufferEXT =
       (_func_void_GLenum_GLuint *)sf::Context::getFunction("glBindRenderbufferEXT");
  uVar1 = bVar8 + 1;
  if (sf_ptrc_glBindRenderbufferEXT != (_func_void_GLenum_GLuint *)0x0) {
    uVar1 = (uint)bVar8;
  }
  sf_ptrc_glCheckFramebufferStatusEXT =
       (_func_GLenum_GLenum *)sf::Context::getFunction("glCheckFramebufferStatusEXT");
  bVar8 = sf_ptrc_glCheckFramebufferStatusEXT == (_func_GLenum_GLenum *)0x0;
  sf_ptrc_glDeleteFramebuffersEXT =
       (_func_void_GLsizei_GLuint_ptr *)sf::Context::getFunction("glDeleteFramebuffersEXT");
  bVar9 = sf_ptrc_glDeleteFramebuffersEXT == (_func_void_GLsizei_GLuint_ptr *)0x0;
  sf_ptrc_glDeleteRenderbuffersEXT =
       (_func_void_GLsizei_GLuint_ptr *)sf::Context::getFunction("glDeleteRenderbuffersEXT");
  bVar2 = sf_ptrc_glDeleteRenderbuffersEXT == (_func_void_GLsizei_GLuint_ptr *)0x0;
  sf_ptrc_glFramebufferRenderbufferEXT =
       (_func_void_GLenum_GLenum_GLenum_GLuint *)
       sf::Context::getFunction("glFramebufferRenderbufferEXT");
  bVar10 = sf_ptrc_glFramebufferRenderbufferEXT == (_func_void_GLenum_GLenum_GLenum_GLuint *)0x0;
  sf_ptrc_glFramebufferTexture1DEXT =
       (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)
       sf::Context::getFunction("glFramebufferTexture1DEXT");
  bVar3 = sf_ptrc_glFramebufferTexture1DEXT == (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)0x0;
  sf_ptrc_glFramebufferTexture2DEXT =
       (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)
       sf::Context::getFunction("glFramebufferTexture2DEXT");
  bVar11 = sf_ptrc_glFramebufferTexture2DEXT == (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)0x0;
  sf_ptrc_glFramebufferTexture3DEXT =
       (_func_void_GLenum_GLenum_GLenum_GLuint_GLint_GLint *)
       sf::Context::getFunction("glFramebufferTexture3DEXT");
  bVar4 = sf_ptrc_glFramebufferTexture3DEXT ==
          (_func_void_GLenum_GLenum_GLenum_GLuint_GLint_GLint *)0x0;
  sf_ptrc_glGenFramebuffersEXT =
       (_func_void_GLsizei_GLuint_ptr *)sf::Context::getFunction("glGenFramebuffersEXT");
  bVar12 = sf_ptrc_glGenFramebuffersEXT == (_func_void_GLsizei_GLuint_ptr *)0x0;
  sf_ptrc_glGenRenderbuffersEXT =
       (_func_void_GLsizei_GLuint_ptr *)sf::Context::getFunction("glGenRenderbuffersEXT");
  bVar5 = sf_ptrc_glGenRenderbuffersEXT == (_func_void_GLsizei_GLuint_ptr *)0x0;
  sf_ptrc_glGenerateMipmapEXT = (_func_void_GLenum *)sf::Context::getFunction("glGenerateMipmapEXT")
  ;
  bVar13 = sf_ptrc_glGenerateMipmapEXT == (_func_void_GLenum *)0x0;
  sf_ptrc_glGetFramebufferAttachmentParameterivEXT =
       (_func_void_GLenum_GLenum_GLenum_GLint_ptr *)
       sf::Context::getFunction("glGetFramebufferAttachmentParameterivEXT");
  bVar6 = sf_ptrc_glGetFramebufferAttachmentParameterivEXT ==
          (_func_void_GLenum_GLenum_GLenum_GLint_ptr *)0x0;
  sf_ptrc_glGetRenderbufferParameterivEXT =
       (_func_void_GLenum_GLenum_GLint_ptr *)
       sf::Context::getFunction("glGetRenderbufferParameterivEXT");
  bVar14 = sf_ptrc_glGetRenderbufferParameterivEXT == (_func_void_GLenum_GLenum_GLint_ptr *)0x0;
  sf_ptrc_glIsFramebufferEXT =
       (_func_GLboolean_GLuint *)sf::Context::getFunction("glIsFramebufferEXT");
  bVar7 = sf_ptrc_glIsFramebufferEXT == (_func_GLboolean_GLuint *)0x0;
  sf_ptrc_glIsRenderbufferEXT =
       (_func_GLboolean_GLuint *)sf::Context::getFunction("glIsRenderbufferEXT");
  bVar15 = sf_ptrc_glIsRenderbufferEXT == (_func_GLboolean_GLuint *)0x0;
  sf_ptrc_glRenderbufferStorageEXT =
       (_func_void_GLenum_GLenum_GLsizei_GLsizei *)
       sf::Context::getFunction("glRenderbufferStorageEXT");
  return (uint)bVar15 +
         (uint)bVar14 +
         (uint)bVar13 +
         (uint)bVar12 +
         (uint)bVar11 + (uint)bVar10 + (uint)bVar9 + uVar1 + bVar8 + (uint)bVar2 + (uint)bVar3 +
         (uint)bVar4 + (uint)bVar5 + (uint)bVar6 + (uint)bVar7 +
         (uint)(sf_ptrc_glRenderbufferStorageEXT == (_func_void_GLenum_GLenum_GLsizei_GLsizei *)0x0)
  ;
}

Assistant:

static sf::GlFunctionPointer glLoaderGetProcAddress(const char* name)
{
    return sf::Context::getFunction(name);
}